

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O0

bool __thiscall Generation::wasUpdated(Generation *this)

{
  bool bVar1;
  undefined1 uVar2;
  long in_RDI;
  unsigned_long onDisk_1;
  File objectFile;
  unsigned_long onDisk;
  File genFile;
  MutexLocker lock;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined7 local_f0;
  undefined1 in_stack_ffffffffffffff17;
  File *in_stack_ffffffffffffff18;
  unsigned_long *in_stack_ffffffffffffff40;
  File *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  File *in_stack_ffffffffffffff80;
  string local_78 [32];
  File local_58;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x2c) & 1) == 0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff18,(string *)(in_RDI + 8));
    File::File(in_stack_ffffffffffffff80,
               (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,(bool)in_stack_ffffffffffffff73,
               (bool)in_stack_ffffffffffffff72,(bool)in_stack_ffffffffffffff71,
               (bool)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    uVar2 = File::isValid((File *)&stack0xffffffffffffff38);
    if ((bool)uVar2) {
      File::lock(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
      in_stack_fffffffffffffef6 =
           File::readULong(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if ((bool)in_stack_fffffffffffffef6) {
        local_1 = CONCAT17(in_stack_ffffffffffffff17,local_f0) != *(long *)(in_RDI + 0x30);
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
    File::~File((File *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)
                                ));
  }
  else {
    MutexLocker::MutexLocker
              ((MutexLocker *)
               CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
               (Mutex *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::string::string(local_78,(string *)(in_RDI + 8));
    File::File(in_stack_ffffffffffffff80,
               (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,(bool)in_stack_ffffffffffffff73,
               (bool)in_stack_ffffffffffffff72,(bool)in_stack_ffffffffffffff71,
               (bool)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_78);
    bVar1 = File::isValid(&local_58);
    if (bVar1) {
      File::lock(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
      bVar1 = File::readULong(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (bVar1) {
        if (CONCAT44(in_stack_ffffffffffffff74,
                     CONCAT13(in_stack_ffffffffffffff73,
                              CONCAT12(in_stack_ffffffffffffff72,
                                       CONCAT11(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70)
                                      ))) == *(long *)(in_RDI + 0x30)) {
          local_1 = false;
        }
        else {
          *(ulong *)(in_RDI + 0x30) =
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,
                                          CONCAT11(in_stack_ffffffffffffff71,
                                                   in_stack_ffffffffffffff70))));
          local_1 = true;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
    File::~File((File *)CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
    MutexLocker::~MutexLocker
              ((MutexLocker *)
               CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Generation::wasUpdated()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask);

		if (!genFile.isValid())
		{
			return true;
		}

		genFile.lock();

		unsigned long onDisk;

		if (!genFile.readULong(onDisk))
		{
			return true;
		}

		if (onDisk != currentValue)
		{
			currentValue = onDisk;
			return true;
		}

		return false;
	}
	else
	{
		File objectFile(path, umask);

		if (!objectFile.isValid())
		{
			return true;
		}

		objectFile.lock();

		unsigned long onDisk;

		if (!objectFile.readULong(onDisk))
		{
			return true;
		}

		return (onDisk != currentValue);
	}
}